

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

char * __thiscall
CVmImageLoader::alloc_and_read(CVmImageLoader *this,size_t read_len,ulong *remaining_size)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (read_len <= *remaining_size) {
    iVar1 = (*this->fp_->_vptr_CVmImageFile[4])(this->fp_,read_len,0);
    *remaining_size = *remaining_size - read_len;
    return (char *)CONCAT44(extraout_var,iVar1);
  }
  err_throw(0x132);
}

Assistant:

const char *CVmImageLoader::alloc_and_read(size_t read_len,
                                           ulong *remaining_size)
{
    const char *p;
    
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* allocate space, and read the data into the new space */
    p = fp_->alloc_and_read(read_len, 0, *remaining_size);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* return the pointer to the new space */
    return p;
}